

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# diskdata.c
# Opt level: O0

FILE * OpenDataFile(char *mode)

{
  int iVar1;
  char *pcVar2;
  char *homeDir;
  stat sb;
  char filePath [256];
  char *mode_local;
  
  pcVar2 = getenv("HOME");
  if (pcVar2 == (char *)0x0) {
    mode_local = (char *)0x0;
  }
  else {
    sprintf((char *)(sb.__glibc_reserved + 2),"%s/%s",pcVar2,SubDirName);
    iVar1 = stat((char *)(sb.__glibc_reserved + 2),(stat *)&homeDir);
    if (((iVar1 == 0) && (((uint)sb.st_nlink & 0xf000) == 0x4000)) ||
       (iVar1 = mkdir((char *)(sb.__glibc_reserved + 2),0x1e8), iVar1 == 0)) {
      sprintf((char *)(sb.__glibc_reserved + 2),"%s/%s/%s",pcVar2,SubDirName,FileName);
      mode_local = (char *)fopen((char *)(sb.__glibc_reserved + 2),mode);
    }
    else {
      mode_local = (char *)0x0;
    }
  }
  return (FILE *)mode_local;
}

Assistant:

static FILE* OpenDataFile(const char* mode)
{
  char filePath[256];
  struct stat sb;
  const char* homeDir = getenv("HOME");

  if (homeDir) {
    sprintf(filePath, "%s/%s", homeDir, SubDirName);
    if (stat(filePath, &sb) == RET_OK && S_ISDIR(sb.st_mode)) {
      // directory exits
    } else {
      if (mkdir(filePath, 0750) != RET_OK) {
        return NULL; // failed to create directory
      }
    }

    sprintf(filePath, "%s/%s/%s", homeDir, SubDirName, FileName);
    return fopen(filePath, mode);
  }

  return NULL;
}